

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O3

void __thiscall QtMWidgets::PageView::_q_currentIndexChanged(PageView *this,int index,int prev)

{
  PageViewPrivate *this_00;
  
  if ((-1 < prev) && ((long)(ulong)(uint)prev < (((this->d).d)->pages).d.size)) {
    QWidget::hide();
  }
  if ((-1 < index) && (this_00 = (this->d).d, (long)(ulong)(uint)index < (this_00->pages).d.size)) {
    PageViewPrivate::showPage(this_00,index);
    return;
  }
  return;
}

Assistant:

void
PageView::_q_currentIndexChanged( int index, int prev )
{
	if( prev >= 0 && prev < d->pages.count() )
		d->pages.at( prev )->hide();

	if( index >= 0 && index < d->pages.count() )
		d->showPage( index );
}